

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::SamFormatParser::ParsePGLine(SamFormatParser *this,string *line)

{
  size_type __n;
  bool bVar1;
  int iVar2;
  BamException *this_00;
  string *this_01;
  string *psVar3;
  pointer pbVar4;
  string tokenTag;
  CustomHeaderTag otherTag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string tokenValue;
  SamProgram pg;
  string local_1a8;
  undefined1 local_188 [32];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  SamFormatParser *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 local_108 [64];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> local_68 [2];
  
  this_01 = line;
  local_148 = this;
  SamProgram::SamProgram((SamProgram *)local_108);
  Split(&local_140,(SamFormatParser *)this_01,line,'\t');
  if (local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)pbVar4);
      std::__cxx11::string::substr((ulong)local_128,(ulong)pbVar4);
      __n = local_1a8._M_string_length;
      if (local_1a8._M_string_length == _DAT_0016edf0) {
        psVar3 = (string *)(local_108 + 0x20);
        if (local_1a8._M_string_length != 0) {
          iVar2 = bcmp(local_1a8._M_dataplus._M_p,Constants::SAM_PG_ID_TAG_abi_cxx11_,
                       local_1a8._M_string_length);
          psVar3 = (string *)(local_108 + 0x20);
          if (iVar2 != 0) goto LAB_00153a4b;
        }
LAB_00153bb9:
        std::__cxx11::string::_M_assign(psVar3);
      }
      else {
LAB_00153a4b:
        if (__n == DAT_0016ee10) {
          psVar3 = local_c8;
          if (__n != 0) {
            iVar2 = bcmp(local_1a8._M_dataplus._M_p,Constants::SAM_PG_NAME_TAG_abi_cxx11_,__n);
            psVar3 = local_c8;
            if (iVar2 != 0) goto LAB_00153a88;
          }
          goto LAB_00153bb9;
        }
LAB_00153a88:
        if (__n == DAT_0016edd0) {
          psVar3 = (string *)local_108;
          if (__n != 0) {
            iVar2 = bcmp(local_1a8._M_dataplus._M_p,Constants::SAM_PG_COMMANDLINE_TAG_abi_cxx11_,__n
                        );
            psVar3 = (string *)local_108;
            if (iVar2 != 0) goto LAB_00153ac5;
          }
          goto LAB_00153bb9;
        }
LAB_00153ac5:
        if (__n == DAT_0016ee30) {
          psVar3 = local_a8;
          if (__n != 0) {
            iVar2 = bcmp(local_1a8._M_dataplus._M_p,Constants::SAM_PG_PREVIOUSPROGRAM_TAG_abi_cxx11_
                         ,__n);
            psVar3 = local_a8;
            if (iVar2 != 0) goto LAB_00153b02;
          }
          goto LAB_00153bb9;
        }
LAB_00153b02:
        if (__n == DAT_0016ee50) {
          psVar3 = local_88;
          if (__n != 0) {
            iVar2 = bcmp(local_1a8._M_dataplus._M_p,Constants::SAM_PG_VERSION_TAG_abi_cxx11_,__n);
            psVar3 = local_88;
            if (iVar2 != 0) goto LAB_00153b3b;
          }
          goto LAB_00153bb9;
        }
LAB_00153b3b:
        local_188._0_8_ = local_188 + 0x10;
        local_188._8_8_ = 0;
        local_188[0x10] = '\0';
        local_168._M_p = (pointer)&local_158;
        local_160 = 0;
        local_158._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)local_188);
        std::__cxx11::string::_M_assign((string *)&local_168);
        std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::
        push_back(local_68,(value_type *)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_p != &local_158) {
          operator_delete(local_168._M_p);
        }
        if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
          operator_delete((void *)local_188._0_8_);
        }
      }
      if (local_128[0] != local_118) {
        operator_delete(local_128[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_140.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar1 = SamProgram::HasID((SamProgram *)local_108);
  if (bVar1) {
    SamProgramChain::Add(&local_148->m_header->Programs,(SamProgram *)local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_140);
    SamProgram::~SamProgram((SamProgram *)local_108);
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_188._0_8_ = local_188 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"SamFormatParser::ParsePGLine","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a8,"@PG line is missing ID tag","");
  BamException::BamException(this_00,(string *)local_188,&local_1a8);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void SamFormatParser::ParsePGLine(const string& line) {

    SamProgram pg;

    // split string into tokens
    vector<string> tokens = Split(line, Constants::SAM_TAB);

    // iterate over tokens
    vector<string>::const_iterator tokenIter = tokens.begin();
    vector<string>::const_iterator tokenEnd  = tokens.end();
    for ( ; tokenIter != tokenEnd; ++tokenIter ) {

        // get token tag/value
        const string tokenTag = (*tokenIter).substr(0,2);
        const string tokenValue = (*tokenIter).substr(3);

        // set program record contents
        if      ( tokenTag == Constants::SAM_PG_ID_TAG              ) pg.ID = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_NAME_TAG            ) pg.Name = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_COMMANDLINE_TAG     ) pg.CommandLine = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_PREVIOUSPROGRAM_TAG ) pg.PreviousProgramID = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_VERSION_TAG         ) pg.Version = tokenValue;
        else { // custom tag
            CustomHeaderTag otherTag;
            otherTag.TagName  = tokenTag;
            otherTag.TagValue = tokenValue;
            pg.CustomTags.push_back(otherTag);
        }
    }

    // check for required tags
    if ( !pg.HasID() )
        throw BamException("SamFormatParser::ParsePGLine", "@PG line is missing ID tag");

    // store SAM program entry
    m_header.Programs.Add(pg);
}